

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffglkut(fitsfile *fptr,char *keyname,int firstchar,int maxvalchar,int maxcomchar,char *value,
           int *valuelen,char *comm,int *comlen,int *status)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t local_170;
  size_t lenc;
  size_t len;
  int local_158;
  int savedKeyPos;
  int lenOnly;
  int keynum;
  int addCommDelim;
  int contin;
  char *dynComStr;
  char *dynValStr;
  char card [81];
  char local_d8 [8];
  char comstring [73];
  char valstring [71];
  char *value_local;
  int maxcomchar_local;
  int maxvalchar_local;
  int firstchar_local;
  char *keyname_local;
  fitsfile *fptr_local;
  
  dynComStr = (char *)0x0;
  _addCommDelim = (char *)0x0;
  lenOnly = 0;
  savedKeyPos = 0;
  local_158 = 0;
  len._4_4_ = 1;
  if (*status < 1) {
    if ((maxvalchar == 0) && (maxcomchar == 0)) {
      local_158 = 1;
    }
    if (value != (char *)0x0) {
      *value = '\0';
    }
    if (comm != (char *)0x0) {
      *comm = '\0';
    }
    *valuelen = 0;
    *comlen = 0;
    dynValStr._0_1_ = 0;
    comstring[0x48] = '\0';
    local_d8[0] = '\0';
    ffgcrd(fptr,keyname,(char *)&dynValStr,status);
    if (*status < 1) {
      ffpsvc((char *)&dynValStr,comstring + 0x48,local_d8,status);
      if (*status < 1) {
        sVar2 = strlen((char *)&dynValStr);
        if ((sVar2 < 0x50) && (local_d8[0] != '\0')) {
          lenOnly = 1;
        }
        if ((local_158 != 0) &&
           (ffghps(fptr,(int *)0x0,(int *)((long)&len + 4),status), 1 < len._4_4_)) {
          len._4_4_ = len._4_4_ + -1;
        }
        if (comstring[0x48] == '\0') {
          dynComStr = (char *)malloc(1);
          *dynComStr = '\0';
          _addCommDelim = (char *)malloc(1);
          *_addCommDelim = '\0';
        }
        else {
          sVar2 = strlen(comstring + 0x48);
          dynComStr = (char *)malloc(sVar2 + 1);
          ffc2s(comstring + 0x48,dynComStr,status);
          lenc = strlen(dynComStr);
          sVar2 = strlen(local_d8);
          _addCommDelim = (char *)malloc(sVar2 + 1);
          *_addCommDelim = '\0';
          strcpy(_addCommDelim,local_d8);
          local_170 = strlen(_addCommDelim);
          keynum = 1;
          while( true ) {
            bVar1 = false;
            if (keynum != 0) {
              bVar1 = *status < 1;
            }
            if (!bVar1) break;
            if ((lenc == 0) || (dynComStr[lenc - 1] != '&')) {
              keynum = 0;
            }
            else {
              comstring[0x48] = '\0';
              local_d8[0] = '\0';
              ffgcnt(fptr,comstring + 0x48,local_d8,status);
              if ((comstring[0x48] == '\0') && (local_d8[0] == '\0')) {
                keynum = 0;
              }
              else {
                dynComStr[lenc - 1] = '\0';
                lenc = lenc - 1;
                if (comstring[0x48] != '\0') {
                  sVar2 = strlen(comstring + 0x48);
                  lenc = sVar2 + lenc;
                  dynComStr = (char *)realloc(dynComStr,lenc + 1);
                  strcat(dynComStr,comstring + 0x48);
                }
                if (local_d8[0] != '\0') {
                  if (lenOnly == 0) {
                    sVar2 = strlen(local_d8);
                    local_170 = sVar2 + local_170;
                    _addCommDelim = (char *)realloc(_addCommDelim,local_170 + 1);
                    strcat(_addCommDelim,local_d8);
                  }
                  else {
                    sVar2 = strlen(local_d8);
                    local_170 = sVar2 + 1 + local_170;
                    _addCommDelim = (char *)realloc(_addCommDelim,local_170 + 1);
                    strcat(_addCommDelim," ");
                    strcat(_addCommDelim,local_d8);
                  }
                }
                ffghps(fptr,(int *)0x0,&savedKeyPos,status);
                ffgrec(fptr,savedKeyPos + -1,(char *)&dynValStr,status);
                sVar2 = strlen((char *)&dynValStr);
                lenOnly = (int)(sVar2 < 0x50 && local_170 != 0);
              }
            }
          }
        }
        sVar2 = strlen(dynComStr);
        sVar3 = strlen(_addCommDelim);
        *valuelen = (int)sVar2;
        *comlen = (int)sVar3;
        if (local_158 == 0) {
          if ((value != (char *)0x0) && ((ulong)(long)firstchar <= sVar2)) {
            strncat(value,dynComStr + (long)firstchar + -1,(long)maxvalchar);
          }
          if (comm != (char *)0x0) {
            strncat(comm,_addCommDelim,(long)maxcomchar);
          }
        }
        else {
          ffmaky(fptr,len._4_4_,status);
        }
        free(dynComStr);
        free(_addCommDelim);
        fptr_local._4_4_ = *status;
      }
      else {
        fptr_local._4_4_ = *status;
      }
    }
    else {
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffglkut( fitsfile *fptr,     /* I - FITS file pointer             */
           const char *keyname, /* I - name of keyword to read       */
           int firstchar,       /* I - first character of string to return */
           int maxvalchar,         /* I - maximum length of string to return */
	                        /*    (string will be null terminated)  */      
           int maxcomchar,      /* I - maximum length of comment to return */
           char *value,         /* O - pointer to keyword value (may be NULL) */
           int *valuelen,       /* O - total length of the keyword value string */
                                /*     The returned 'value' string may only */
				/*     contain a piece of the total string, depending */
				/*     on the value of firstchar and maxvalchar */
           char *comm,          /* O - keyword comment (may be NULL) */
           int *comlen,         /* O - total length of comment string */
           int  *status)        /* IO - error status                 */
{
    char valstring[FLEN_VALUE], comstring[FLEN_COMMENT], card[FLEN_CARD];
    char *dynValStr=0, *dynComStr=0;
    int contin, addCommDelim=0, keynum=0;
    int lenOnly=0, savedKeyPos=1;
    size_t len=0, lenc=0;

    if (*status > 0)
        return(*status);

    if (maxvalchar==0 && maxcomchar==0)
       lenOnly = 1;
    
    if (value)
       *value = '\0';
    if (comm)
       *comm = '\0';
    /* If lenOnly, 'value' and 'comm' should not be accessed after this point.*/
    
    *valuelen = 0; 
    *comlen = 0;   
    card[0] = '\0';
    valstring[0] = '\0';
    comstring[0] = '\0';
       
    ffgcrd(fptr, keyname, card, status);
    if (*status > 0)
       return(*status);
    ffpsvc(card,valstring, comstring, status);    
    if (*status > 0)
        return(*status);
    if (strlen(card) < FLEN_CARD-1 && *comstring)
       addCommDelim=1;
        
    /* If called in lenOnly mode, there's a good chance the user will soon call
       this again to read the value string.  Therefore we'll save and later restore
       the original keyword position. */
    if (lenOnly)
    {
       ffghps(fptr, 0, &savedKeyPos, status);
       if (savedKeyPos > 1)
          savedKeyPos -= 1;
    }

    if (!valstring[0])   /* null value string? */
    {
      dynValStr = (char *) malloc(1);  /* allocate and return a null string */
      *dynValStr = '\0';      
      dynComStr = (char *)malloc(1);
      *dynComStr= '\0';
    }
    else
    {
      /* allocate space,  plus 1 for null */
      dynValStr = (char *) malloc(strlen(valstring) + 1);

      ffc2s(valstring, dynValStr, status);   /* convert string to value */
      len = strlen(dynValStr);
      
      dynComStr = (char *) malloc(strlen(comstring)+1);
      dynComStr[0]=0;
      strcpy(dynComStr, comstring);
      lenc = strlen(dynComStr);

      /* If last character is a & then value may be continued on next keyword */
      contin = 1;
      while (contin && *status <= 0)  
      {
        if (len && *(dynValStr+len-1) == '&')  /*  is last char an ampersand?  */
        {
            valstring[0] = '\0';
            comstring[0] = '\0';
            ffgcnt(fptr, valstring, comstring, status);
            if (*valstring || *comstring)  /* If either valstring or comstring
                                  is filled, this must be a CONTINUE line */  
            {
               *(dynValStr+len-1) = '\0';         /* erase the trailing & char */
               len -= 1;
               if (*valstring)
               {
                  len += strlen(valstring);
                  dynValStr = (char *) realloc(dynValStr, len + 1); /* increase size */
                  strcat(dynValStr, valstring);     /* append the continued chars */
               }
               if (*comstring)
               {
                  /* concantenate comment strings */
                  if (addCommDelim)
                  {
                     lenc += strlen(comstring) + 1;
                     dynComStr = (char *) realloc(dynComStr, lenc + 1);
                     strcat(dynComStr, " ");
                     strcat(dynComStr, comstring);
                  }
                  else
                  {
                     lenc += strlen(comstring);
                     dynComStr = (char *) realloc(dynComStr, lenc + 1);
                     strcat(dynComStr, comstring);                     
                  }
               }
               /* Determine if a space delimiter is needed for next
                  comment concatenation (if any).  Assume it is if card length
                  of the most recently read keyword is less than max. 
                  keynum is 1-based. */
               ffghps(fptr,0,&keynum,status);
               ffgrec(fptr, keynum-1, card, status);
               addCommDelim = ((strlen(card) < FLEN_CARD-1) && lenc) ? 1 : 0;
            }
            else
	    {
                contin = 0;
            }
        }
        else
	{
            contin = 0;
	}
      }
    }
    
    /* Resetting len and lenc really shouldn't be necessary here, but
       just to make sure ... */
    len = strlen(dynValStr);
    lenc = strlen(dynComStr);
    *valuelen = len;
    *comlen = lenc;
    if (lenOnly)
       ffmaky(fptr, savedKeyPos, status);
    else
    {
       if (value)
       {
          if (firstchar <= len)
             strncat(value,dynValStr+firstchar-1,maxvalchar);
       }
       if (comm)
       {
          strncat(comm,dynComStr,maxcomchar);
       }
    }
    
    free(dynValStr);
    free(dynComStr);
        
    return(*status);
}